

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::routeMessage(CoreBroker *this,ActionMessage *cmd)

{
  bool bVar1;
  route_id rVar2;
  long in_RSI;
  long *in_RDI;
  route_id route;
  GlobalBrokerId id;
  undefined4 uVar3;
  
  uVar3 = 0;
  bVar1 = GlobalFederateId::operator==((GlobalFederateId *)(in_RSI + 0x10),(GlobalBrokerId)0x0);
  if (!bVar1) {
    id.gid = (BaseType)in_RDI[3];
    bVar1 = GlobalFederateId::operator==((GlobalFederateId *)(in_RSI + 0x10),id);
    if (!bVar1) {
      rVar2 = getRoute((CoreBroker *)CONCAT44(uVar3,id.gid),(GlobalFederateId)(BaseType)in_RSI);
      (**(code **)(*in_RDI + 0x118))(in_RDI,rVar2.rid,in_RSI);
      return;
    }
  }
  (**(code **)(*in_RDI + 0x118))(in_RDI,0,in_RSI);
  return;
}

Assistant:

void CoreBroker::routeMessage(ActionMessage&& cmd)
{
    if ((cmd.dest_id == parent_broker_id) || (cmd.dest_id == higher_broker_id)) {
        transmit(parent_route_id, std::move(cmd));
    } else {
        auto route = getRoute(cmd.dest_id);
        transmit(route, std::move(cmd));
    }
}